

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeZone.cc
# Opt level: O3

tm * __thiscall
muduo::TimeZone::toLocalTime(tm *__return_storage_ptr__,TimeZone *this,time_t seconds)

{
  Data *data;
  Transition sentry;
  undefined1 auVar1 [20];
  Localtime *pLVar2;
  time_t localSeconds;
  undefined4 in_stack_ffffffffffffffd4;
  long local_28;
  
  __return_storage_ptr__->tm_zone = (char *)0x0;
  *(undefined8 *)&__return_storage_ptr__->tm_isdst = 0;
  __return_storage_ptr__->tm_gmtoff = 0;
  __return_storage_ptr__->tm_mon = 0;
  __return_storage_ptr__->tm_year = 0;
  __return_storage_ptr__->tm_wday = 0;
  __return_storage_ptr__->tm_yday = 0;
  __return_storage_ptr__->tm_sec = 0;
  __return_storage_ptr__->tm_min = 0;
  __return_storage_ptr__->tm_hour = 0;
  __return_storage_ptr__->tm_mday = 0;
  data = (this->data_).super___shared_ptr<muduo::TimeZone::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  auVar1 = ZEXT820((ulong)seconds);
  sentry._20_4_ = in_stack_ffffffffffffffd4;
  sentry.gmttime = auVar1._0_8_;
  sentry.localtime = auVar1._8_8_;
  sentry.localtimeIdx = auVar1._16_4_;
  pLVar2 = detail::findLocaltime(data,sentry,(Comp)0x1);
  if (pLVar2 != (Localtime *)0x0) {
    local_28 = seconds + pLVar2->gmtOffset;
    gmtime_r(&local_28,(tm *)__return_storage_ptr__);
    __return_storage_ptr__->tm_isdst = (uint)pLVar2->isDst;
    __return_storage_ptr__->tm_gmtoff = pLVar2->gmtOffset;
    __return_storage_ptr__->tm_zone = (data->abbreviation)._M_dataplus._M_p + pLVar2->arrbIdx;
  }
  return __return_storage_ptr__;
}

Assistant:

struct tm TimeZone::toLocalTime(time_t seconds) const
{
  struct tm localTime;
  memZero(&localTime, sizeof(localTime));
  assert(data_ != NULL);
  const Data& data(*data_);

  detail::Transition sentry(seconds, 0, 0);
  const detail::Localtime* local = findLocaltime(data, sentry, detail::Comp(true));

  if (local)
  {
    time_t localSeconds = seconds + local->gmtOffset;
    ::gmtime_r(&localSeconds, &localTime); // FIXME: fromUtcTime
    localTime.tm_isdst = local->isDst;
    localTime.tm_gmtoff = local->gmtOffset;
    localTime.tm_zone = &data.abbreviation[local->arrbIdx];
  }

  return localTime;
}